

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::Builder(Builder *this,uint spvVersion,uint magicNumber,SpvBuildLogger *buildLogger)

{
  SpvBuildLogger *buildLogger_local;
  uint magicNumber_local;
  uint spvVersion_local;
  Builder *this_local;
  
  this->_vptr_Builder = (_func_int **)&PTR__Builder_010dd358;
  std::
  unordered_map<unsigned_int,_spv::Builder::DebugTypeLoc,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>_>
  ::unordered_map(&this->debugTypeLocs);
  this->spvVersion = spvVersion;
  this->sourceLang = SourceLanguageUnknown;
  this->sourceVersion = 0;
  this->nonSemanticShaderCompilationUnitId = 0;
  this->nonSemanticShaderDebugInfo = 0;
  this->debugInfoNone = 0;
  this->debugExpression = 0;
  std::__cxx11::string::string((string *)&this->sourceText);
  this->currentLine = 0;
  this->currentFileId = 0;
  this->mainFileId = 0;
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)
             &this->currentDebugScopeId);
  this->trackDebugInfo = false;
  this->emitSpirvDebugInfo = false;
  this->emitNonSemanticShaderDebugInfo = false;
  this->restoreNonSemanticShaderDebugInfo = false;
  this->emitNonSemanticShaderDebugSource = false;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->extensions);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->sourceExtensions);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->moduleProcesses);
  this->addressModel = AddressingModelLogical;
  this->memoryModel = GLSL450;
  std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>::set
            (&this->capabilities);
  this->builderNumber = magicNumber;
  Module::Module(&this->module);
  this->buildPoint = (Block *)0x0;
  this->uniqueId = 0;
  this->entryPointFunction = (Function *)0x0;
  this->generatingOpCodeForSpecConst = false;
  this->useReplicatedComposites = false;
  AccessChain::AccessChain(&this->accessChain);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::vector(&this->strings);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::vector(&this->imports);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::vector(&this->entryPoints);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::vector(&this->executionModes);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::vector(&this->names);
  std::
  set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::set(&this->decorations);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::vector(&this->constantsTypesGlobals);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::vector(&this->externals);
  std::
  vector<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_std::allocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
  ::vector(&this->functions);
  std::
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  ::unordered_map(&this->groupedConstants);
  std::
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  ::unordered_map(&this->groupedStructConstants);
  std::
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  ::unordered_map(&this->groupedTypes);
  std::
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  ::unordered_map(&this->groupedDebugTypes);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::vector(&this->nullConstants)
  ;
  std::stack<spv::Block*,std::deque<spv::Block*,std::allocator<spv::Block*>>>::
  stack<std::deque<spv::Block*,std::allocator<spv::Block*>>,void>
            ((stack<spv::Block*,std::deque<spv::Block*,std::allocator<spv::Block*>>> *)
             &this->switchMerges);
  std::
  stack<spv::Builder::LoopBlocks,std::deque<spv::Builder::LoopBlocks,std::allocator<spv::Builder::LoopBlocks>>>
  ::stack<std::deque<spv::Builder::LoopBlocks,std::allocator<spv::Builder::LoopBlocks>>,void>
            ((stack<spv::Builder::LoopBlocks,std::deque<spv::Builder::LoopBlocks,std::allocator<spv::Builder::LoopBlocks>>>
              *)&this->loops);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map(&this->stringIds);
  std::
  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::map(&this->includeFiles);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::map(&this->debugId);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->debugSourceId);
  this->logger = buildLogger;
  clearAccessChain(this);
  return;
}

Assistant:

Builder::Builder(unsigned int spvVersion, unsigned int magicNumber, SpvBuildLogger* buildLogger) :
    spvVersion(spvVersion),
    sourceLang(SourceLanguageUnknown),
    sourceVersion(0),
    addressModel(AddressingModelLogical),
    memoryModel(MemoryModelGLSL450),
    builderNumber(magicNumber),
    buildPoint(nullptr),
    uniqueId(0),
    entryPointFunction(nullptr),
    generatingOpCodeForSpecConst(false),
    logger(buildLogger)
{
    clearAccessChain();
}